

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface_p.h
# Opt level: O0

void __thiscall QWindowSystemInterfacePrivate::TabletEvent::~TabletEvent(TabletEvent *this)

{
  void *in_RDI;
  
  ~TabletEvent((TabletEvent *)0x44fa7c);
  operator_delete(in_RDI,0x98);
  return;
}

Assistant:

class Q_GUI_EXPORT TabletEvent : public PointerEvent {
    public:
        // TODO take QPointingDevice* instead of types and IDs
        static void handleTabletEvent(QWindow *w, const QPointF &local, const QPointF &global,
                                      int device, int pointerType, Qt::MouseButtons buttons, qreal pressure, qreal xTilt, qreal yTilt,
                                      qreal tangentialPressure, qreal rotation, int z, qint64 uid,
                                      Qt::KeyboardModifiers modifiers = Qt::NoModifier);
        static void setPlatformSynthesizesMouse(bool v);

        TabletEvent(QWindow *w, ulong time, const QPointF &local, const QPointF &global,
                    const QPointingDevice *device, Qt::MouseButtons b, qreal pressure, qreal xTilt, qreal yTilt, qreal tpressure,
                    qreal rotation, int z, Qt::KeyboardModifiers mods)
            : PointerEvent(w, time, Tablet, mods, device),
              buttons(b), local(local), global(global),
              pressure(pressure), xTilt(xTilt), yTilt(yTilt), tangentialPressure(tpressure),
              rotation(rotation), z(z) { }
        Qt::MouseButtons buttons;
        QPointF local;
        QPointF global;
        qreal pressure;
        qreal xTilt;
        qreal yTilt;
        qreal tangentialPressure;
        qreal rotation;
        int z;
        static bool platformSynthesizesMouse;
    }